

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O0

void Ivy_TruthTestOne(uint uTruth)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint local_c [2];
  uint uTruth_local;
  
  local_c[0] = uTruth;
  if (Ivy_TruthTestOne::vTree == (Vec_Int_t *)0x0) {
    Ivy_TruthTestOne::vTree = Vec_IntAlloc(0xc);
  }
  iVar2 = Ivy_TruthDsd(local_c[0],Ivy_TruthTestOne::vTree);
  if (iVar2 != 0) {
    Ivy_TruthTestOne::Counter = Ivy_TruthTestOne::Counter + 1;
    printf("%5d : ");
    Extra_PrintBinary(_stdout,local_c,0x20);
    printf("  ");
    Ivy_TruthDsdPrint(_stdout,Ivy_TruthTestOne::vTree);
    uVar1 = local_c[0];
    uVar3 = Ivy_TruthDsdCompute(Ivy_TruthTestOne::vTree);
    if (uVar1 != uVar3) {
      printf("Verification failed.\n");
    }
  }
  return;
}

Assistant:

void Ivy_TruthTestOne( unsigned uTruth )
{
    static int Counter = 0;
    static Vec_Int_t * vTree = NULL;
    // decompose
    if ( vTree == NULL )
        vTree = Vec_IntAlloc( 12 );

    if ( !Ivy_TruthDsd( uTruth, vTree ) )
    {
//        printf( "Undecomposable\n" );
    }
    else
    {
//        nTruthDsd++;
        printf( "%5d : ", Counter++ );
        Extra_PrintBinary( stdout, &uTruth, 32 );
        printf( "  " );
        Ivy_TruthDsdPrint( stdout, vTree );
        if ( uTruth != Ivy_TruthDsdCompute(vTree) )
            printf( "Verification failed.\n" );
    }
//    Vec_IntFree( vTree );
}